

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O3

int secp256k1_ecdsa_sig_verify
              (secp256k1_scalar *sigr,secp256k1_scalar *sigs,secp256k1_ge *pubkey,
              secp256k1_scalar *message)

{
  undefined4 extraout_EAX;
  int iVar1;
  undefined4 extraout_EAX_00;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar sn;
  secp256k1_gej pr;
  secp256k1_fe xr;
  secp256k1_gej pubkeyj;
  secp256k1_fe aux [8];
  uchar c [32];
  secp256k1_strauss_state local_ab8;
  secp256k1_scalar local_aa0;
  secp256k1_scalar local_a80;
  secp256k1_scalar local_a60;
  secp256k1_gej local_a40;
  secp256k1_strauss_point_state local_9a8;
  secp256k1_gej local_590;
  secp256k1_fe local_4f8 [8];
  secp256k1_ge local_378 [8];
  
  secp256k1_scalar_verify(sigr);
  auVar3._0_4_ = -(uint)((int)sigr->d[2] == 0 && (int)sigr->d[0] == 0);
  auVar3._4_4_ = -(uint)(*(int *)((long)sigr->d + 0x14) == 0 && *(int *)((long)sigr->d + 4) == 0);
  auVar3._8_4_ = -(uint)((int)sigr->d[3] == 0 && (int)sigr->d[1] == 0);
  auVar3._12_4_ = -(uint)(*(int *)((long)sigr->d + 0x1c) == 0 && *(int *)((long)sigr->d + 0xc) == 0)
  ;
  iVar1 = movmskps(extraout_EAX,auVar3);
  iVar2 = 0;
  if (iVar1 != 0xf) {
    secp256k1_scalar_verify(sigs);
    auVar4._0_4_ = -(uint)((int)sigs->d[2] == 0 && (int)sigs->d[0] == 0);
    auVar4._4_4_ = -(uint)(*(int *)((long)sigs->d + 0x14) == 0 && *(int *)((long)sigs->d + 4) == 0);
    auVar4._8_4_ = -(uint)((int)sigs->d[3] == 0 && (int)sigs->d[1] == 0);
    auVar4._12_4_ =
         -(uint)(*(int *)((long)sigs->d + 0x1c) == 0 && *(int *)((long)sigs->d + 0xc) == 0);
    iVar1 = movmskps(extraout_EAX_00,auVar4);
    iVar2 = 0;
    if (iVar1 != 0xf) {
      secp256k1_scalar_inverse_var(&local_a60,sigs);
      secp256k1_scalar_mul(&local_a80,&local_a60,message);
      secp256k1_scalar_mul(&local_aa0,&local_a60,sigr);
      secp256k1_gej_set_ge(&local_590,pubkey);
      local_ab8.aux = local_4f8;
      local_ab8.pre_a = local_378;
      local_ab8.ps = &local_9a8;
      secp256k1_ecmult_strauss_wnaf(&local_ab8,&local_a40,1,&local_590,&local_aa0,&local_a80);
      secp256k1_gej_verify(&local_a40);
      if (local_a40.infinity == 0) {
        secp256k1_scalar_get_b32((uchar *)local_378,sigr);
        secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)&local_9a8,(uchar *)local_378);
        if ((((ulong)local_9a8.wnaf_na_1._0_8_ < 0xffffefffffc2f) ||
            (local_9a8.wnaf_na_1._32_8_ != 0xffffffffffff)) ||
           ((local_9a8.wnaf_na_1._16_8_ & local_9a8.wnaf_na_1._24_8_ & local_9a8.wnaf_na_1._8_8_) !=
            0xfffffffffffff)) {
          local_9a8.wnaf_na_1[10] = 1;
          local_9a8.wnaf_na_1[0xb] = 1;
          secp256k1_fe_verify((secp256k1_fe *)&local_9a8);
        }
        else {
          local_9a8.wnaf_na_1[10] = -1;
        }
        iVar1 = secp256k1_gej_eq_x_var((secp256k1_fe *)&local_9a8,&local_a40);
        iVar2 = 1;
        if (iVar1 == 0) {
          iVar1 = secp256k1_fe_cmp_var
                            ((secp256k1_fe *)&local_9a8,&secp256k1_ecdsa_const_p_minus_order);
          iVar2 = 0;
          if (iVar1 < 0) {
            secp256k1_fe_add((secp256k1_fe *)&local_9a8,&secp256k1_ecdsa_const_order_as_fe);
            iVar2 = secp256k1_gej_eq_x_var((secp256k1_fe *)&local_9a8,&local_a40);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int secp256k1_ecdsa_sig_verify(const secp256k1_scalar *sigr, const secp256k1_scalar *sigs, const secp256k1_ge *pubkey, const secp256k1_scalar *message) {
    unsigned char c[32];
    secp256k1_scalar sn, u1, u2;
#if !defined(EXHAUSTIVE_TEST_ORDER)
    secp256k1_fe xr;
#endif
    secp256k1_gej pubkeyj;
    secp256k1_gej pr;

    if (secp256k1_scalar_is_zero(sigr) || secp256k1_scalar_is_zero(sigs)) {
        return 0;
    }

    secp256k1_scalar_inverse_var(&sn, sigs);
    secp256k1_scalar_mul(&u1, &sn, message);
    secp256k1_scalar_mul(&u2, &sn, sigr);
    secp256k1_gej_set_ge(&pubkeyj, pubkey);
    secp256k1_ecmult(&pr, &pubkeyj, &u2, &u1);
    if (secp256k1_gej_is_infinity(&pr)) {
        return 0;
    }

#if defined(EXHAUSTIVE_TEST_ORDER)
{
    secp256k1_scalar computed_r;
    secp256k1_ge pr_ge;
    secp256k1_ge_set_gej(&pr_ge, &pr);
    secp256k1_fe_normalize(&pr_ge.x);

    secp256k1_fe_get_b32(c, &pr_ge.x);
    secp256k1_scalar_set_b32(&computed_r, c, NULL);
    return secp256k1_scalar_eq(sigr, &computed_r);
}
#else
    secp256k1_scalar_get_b32(c, sigr);
    /* we can ignore the fe_set_b32_limit return value, because we know the input is in range */
    (void)secp256k1_fe_set_b32_limit(&xr, c);

    /** We now have the recomputed R point in pr, and its claimed x coordinate (modulo n)
     *  in xr. Naively, we would extract the x coordinate from pr (requiring a inversion modulo p),
     *  compute the remainder modulo n, and compare it to xr. However:
     *
     *        xr == X(pr) mod n
     *    <=> exists h. (xr + h * n < p && xr + h * n == X(pr))
     *    [Since 2 * n > p, h can only be 0 or 1]
     *    <=> (xr == X(pr)) || (xr + n < p && xr + n == X(pr))
     *    [In Jacobian coordinates, X(pr) is pr.x / pr.z^2 mod p]
     *    <=> (xr == pr.x / pr.z^2 mod p) || (xr + n < p && xr + n == pr.x / pr.z^2 mod p)
     *    [Multiplying both sides of the equations by pr.z^2 mod p]
     *    <=> (xr * pr.z^2 mod p == pr.x) || (xr + n < p && (xr + n) * pr.z^2 mod p == pr.x)
     *
     *  Thus, we can avoid the inversion, but we have to check both cases separately.
     *  secp256k1_gej_eq_x implements the (xr * pr.z^2 mod p == pr.x) test.
     */
    if (secp256k1_gej_eq_x_var(&xr, &pr)) {
        /* xr * pr.z^2 mod p == pr.x, so the signature is valid. */
        return 1;
    }
    if (secp256k1_fe_cmp_var(&xr, &secp256k1_ecdsa_const_p_minus_order) >= 0) {
        /* xr + n >= p, so we can skip testing the second case. */
        return 0;
    }
    secp256k1_fe_add(&xr, &secp256k1_ecdsa_const_order_as_fe);
    if (secp256k1_gej_eq_x_var(&xr, &pr)) {
        /* (xr + n) * pr.z^2 mod p == pr.x, so the signature is valid. */
        return 1;
    }
    return 0;
#endif
}